

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.h
# Opt level: O0

void __thiscall HFactor::colFixMax(HFactor *this,int iCol)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  double *pdVar5;
  int in_ESI;
  long in_RDI;
  double dVar6;
  int k;
  double maxValue;
  value_type local_28;
  int local_1c;
  double local_18;
  int local_c;
  
  local_18 = 0.0;
  local_c = in_ESI;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe0),(long)in_ESI);
  local_1c = *pvVar3;
  while( true ) {
    iVar2 = local_1c;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe0),(long)local_c);
    iVar1 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf8),(long)local_c);
    if (iVar1 + *pvVar3 <= iVar2) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x158),(long)local_1c);
    local_28 = ABS(*pvVar4);
    pdVar5 = std::max<double>(&local_18,&local_28);
    local_18 = *pdVar5;
    local_1c = local_1c + 1;
  }
  dVar6 = local_18 * 0.1;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x170),(long)local_c);
  *pvVar4 = dVar6;
  return;
}

Assistant:

void colFixMax(const int iCol) {
        double maxValue = 0;
        for (int k = MCstart[iCol]; k < MCstart[iCol] + MCcountA[iCol]; k++)
            maxValue = max(maxValue, fabs(MCvalue[k]));
        MCminpivot[iCol] = maxValue * 0.1;
    }